

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3SrcListFuncArgs(Parse *pParse,SrcList *p,ExprList *pList)

{
  int iVar1;
  SrcItem *pItem;
  ExprList *pList_local;
  SrcList *p_local;
  Parse *pParse_local;
  
  if (p == (SrcList *)0x0) {
    sqlite3ExprListDelete(pParse->db,pList);
  }
  else {
    iVar1 = p->nSrc + -1;
    p->a[iVar1].u1.pFuncArg = pList;
    *(ushort *)&p->a[iVar1].fg.field_0x1 = *(ushort *)&p->a[iVar1].fg.field_0x1 & 0xfffb | 4;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3SrcListFuncArgs(Parse *pParse, SrcList *p, ExprList *pList){
  if( p ){
    SrcItem *pItem = &p->a[p->nSrc-1];
    assert( pItem->fg.notIndexed==0 );
    assert( pItem->fg.isIndexedBy==0 );
    assert( pItem->fg.isTabFunc==0 );
    pItem->u1.pFuncArg = pList;
    pItem->fg.isTabFunc = 1;
  }else{
    sqlite3ExprListDelete(pParse->db, pList);
  }
}